

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O0

void __thiscall Test_aistr_lengthConst_Test::TestBody(Test_aistr_lengthConst_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_t val4;
  Message local_b0;
  int local_a4;
  size_t local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  int local_74;
  size_t local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_50;
  Message local_48 [3];
  int local_2c;
  size_t local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Test_aistr_lengthConst_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_28 = ai::lengthConst("");
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_20,"ai::lengthConst(\"\")","0",&local_28,&local_2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(local_48);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_70 = ai::lengthConst("13245");
    local_74 = 5;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((EqHelper<false> *)local_68,"ai::lengthConst(\"13245\")","5",&local_70,&local_74);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x12,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_a0 = ai::lengthConst("13245 dsfgs");
      local_a4 = 0xb;
      testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                ((EqHelper<false> *)local_98,"ai::lengthConst(\"13245 dsfgs\")","11",&local_a0,
                 &local_a4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&val4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x13,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&val4,&local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&val4);
        testing::Message::~Message(&local_b0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, lengthConst) {
    ASSERT_EQ(ai::lengthConst(""), 0);
    ASSERT_EQ(ai::lengthConst("13245"), 5);
    ASSERT_EQ(ai::lengthConst("13245 dsfgs"), 11);
    constexpr auto val4 = ai::lengthConst("13245 dsfgs");
    static_assert(val4 == 11, "");
}